

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_palette_add(LodePNGColorMode *info,uchar r,uchar g,uchar b,uchar a)

{
  uchar *puVar1;
  
  puVar1 = info->palette;
  if (puVar1 == (uchar *)0x0) {
    puVar1 = (uchar *)malloc(0x400);
    if (puVar1 == (uchar *)0x0) {
      return 0x53;
    }
    info->palette = puVar1;
  }
  puVar1[info->palettesize * 4] = r;
  info->palette[info->palettesize * 4 + 1] = g;
  info->palette[info->palettesize * 4 + 2] = b;
  info->palette[info->palettesize * 4 + 3] = a;
  info->palettesize = info->palettesize + 1;
  return 0;
}

Assistant:

unsigned lodepng_palette_add(LodePNGColorMode* info,
                             unsigned char r, unsigned char g, unsigned char b, unsigned char a)
{
  unsigned char* data;
  /*the same resize technique as C++ std::vectors is used, and here it's made so that for a palette with
  the max of 256 colors, it'll have the exact alloc size*/
  if(!info->palette) /*allocate palette if empty*/
  {
    /*room for 256 colors with 4 bytes each*/
    data = (unsigned char*)lodepng_realloc(info->palette, 1024);
    if(!data) return 83; /*alloc fail*/
    else info->palette = data;
  }
  info->palette[4 * info->palettesize + 0] = r;
  info->palette[4 * info->palettesize + 1] = g;
  info->palette[4 * info->palettesize + 2] = b;
  info->palette[4 * info->palettesize + 3] = a;
  ++info->palettesize;
  return 0;
}